

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)122,(moira::Mode)4,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  u64 value;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)4,_2> dst;
  u32 local_24;
  ushort local_20;
  
  local_20 = op & 7;
  local_24 = *addr;
  value = 8;
  if ((op & 0xe00) != 0) {
    value = (ulong)((byte)(op >> 9) & 7);
  }
  s = &str->ptr;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 's';
    lVar5 = 0;
    do {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "subq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = 'w';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = *s;
        *s = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "$%x.w"[lVar5 + 4];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    sprintd(s,value);
  }
  else {
    cVar4 = 's';
    lVar5 = 0;
    do {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "subq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = 'w';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = *s;
        *s = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "$%x.w"[lVar5 + 4];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(Int)(i32)value);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = *s;
    *s = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)4,_2> *)&local_24);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}